

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defopcode.c
# Opt level: O0

void begin_generating_code(void)

{
  size_t __n;
  size_t size;
  char buf [1024];
  FILE *fp;
  int i;
  
  for (fp._4_4_ = 0; fp._4_4_ < 0x10000; fp._4_4_ = fp._4_4_ + 1) {
    map_index[fp._4_4_] = 0;
  }
  for (fp._4_4_ = 0; fp._4_4_ < 0x10000; fp._4_4_ = fp._4_4_ + 1) {
    synthetic_opcode_taken[fp._4_4_] = 0xfe;
  }
  memset(opcode_map_info,0,0x100000);
  memset(map_info_opcode_name,0,0x80000);
  opcode_map_info[0]._0_4_ = opcode_map_info[0]._0_4_ & 0xffc007fe | 0x31f800;
  map_info_opcode_name[0] = "(reserved)";
  for (fp._4_4_ = 0; fp._4_4_ < 0xb5; fp._4_4_ = fp._4_4_ + 1) {
    synthetic_opcode_taken[fp._4_4_] = 0xff;
  }
  num_map_infos = 1;
  parity = 1;
  if (preprocess_only == FALSE) {
    buf._1016_8_ = fopen("syn68k_header.h","r");
    if ((FILE *)buf._1016_8_ == (FILE *)0x0) {
      fatal_error("Unable to open syn68k_header.h for reading!\n");
    }
    while (__n = fread(&size,1,0x400,(FILE *)buf._1016_8_), __n != 0) {
      fwrite(&size,1,__n,(FILE *)syn68k_c_stream);
    }
    fclose((FILE *)buf._1016_8_);
  }
  return;
}

Assistant:

void
begin_generating_code ()
{
  int i;

  /* Clear mapping table to NO_MAP. */
  for (i = 0; i < 65536; i++)
    map_index[i] = NO_MAP;

  for (i = 0; i < 65536; i++)
    synthetic_opcode_taken[i] = OPCODE_NOT_TAKEN;

  /* Zero the other arrays. */
  memset (opcode_map_info,        0, sizeof opcode_map_info);
  memset (map_info_opcode_name,   0, sizeof map_info_opcode_name);

  /* Set up default "no mapping" map; maps to opcode 0. */
  opcode_map_info[NO_MAP].cc_needed          = M68K_CC_ALL;
  opcode_map_info[NO_MAP].sequence_parity    = 0;
  opcode_map_info[NO_MAP].instruction_words  = 1;
  opcode_map_info[NO_MAP].ends_block         = TRUE;
  opcode_map_info[NO_MAP].next_block_dynamic = TRUE;
  map_info_opcode_name[0] = "(reserved)";

  /* Opcodes 0 through 0xB4 are reserved. */
  for (i = 0; i <= 0xB4; i++)
    synthetic_opcode_taken[i] = OPCODE_TAKEN;

  /* We've used one opcode map, and should now be on odd parity for the
   * next block of opcode maps.
   */
  num_map_infos = 1;
  parity = 1;

  if (!preprocess_only)
    {
      FILE *fp = fopen ("syn68k_header.h", "r");
      char buf[1024];
      size_t size;

      if (fp == NULL)
        fatal_error ("Unable to open syn68k_header.h for reading!\n");

      /* Copy the C preamble out to syn68k.c. */
      while ((size = fread (buf, 1, 1024, fp)) != 0)
	fwrite (buf, 1, size, syn68k_c_stream);

      fclose (fp);
    }
}